

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

UChar32 anon_unknown.dwarf_2d08b9::getRange
                  (void *t,UChar32 start,UCPMapValueFilter *filter,void *context,uint32_t *pValue)

{
  char cVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  UChar32 UVar10;
  uint uVar11;
  uint uVar12;
  uint32_t uVar13;
  ulong uVar14;
  long lVar15;
  ulong in_R11;
  int unaff_R12D;
  long lVar16;
  int iVar17;
  bool bVar18;
  int32_t dataMask;
  int local_ac;
  uint local_a8;
  uint local_a4;
  uint local_9c;
  uint local_88;
  
  UVar10 = -1;
  if ((uint)start < 0x110000) {
    cVar1 = *(char *)((long)t + 0x1f);
    if (start < *(int *)((long)t + 0x18)) {
      uVar5 = *(uint32_t *)((long)t + 0x2c);
      if (filter != (UCPMapValueFilter *)0x0) {
        uVar5 = (*filter)(context,uVar5);
      }
      lVar3 = *t;
      local_9c = 0xffffffff;
      bVar9 = false;
      local_a8 = 0xffffffff;
      uVar7 = start;
      do {
        if (((int)uVar7 < 0x10000) && ((int)uVar7 < 0x1000 || *(char *)((long)t + 0x1e) == '\0')) {
          local_a4 = (int)uVar7 >> 6;
          unaff_R12D = 0x40;
          local_88 = 0x40;
          if (*(char *)((long)t + 0x1e) == '\0') {
            local_88 = 0x400;
          }
          uVar14 = 0;
LAB_002d2b92:
          lVar15 = (long)(int)local_a4;
          uVar11 = local_a4 + 1;
          if ((int)(local_a4 + 1) < (int)local_88) {
            uVar11 = local_88;
          }
          do {
            local_a4 = (uint)lVar15;
            if ((uint)uVar14 < 0x8000) {
              uVar12 = (uint)*(ushort *)(lVar3 + uVar14 * 2 + lVar15 * 2);
            }
            else {
              iVar17 = ((int)local_a4 >> 3) + (local_a4 & 0xfffffff8) + ((uint)uVar14 & 0x7fff);
              uVar12 = (uint)*(ushort *)(lVar3 + (long)(int)((local_a4 & 7) + iVar17 + 1) * 2) |
                       (uint)*(ushort *)(lVar3 + (long)iVar17 * 2) <<
                       (char)(local_a4 & 7) * '\x02' + 2 & 0x30000;
            }
            iVar17 = local_ac;
            if ((uVar12 == local_9c) && (unaff_R12D <= (int)(uVar7 - start))) {
              uVar7 = uVar7 + unaff_R12D;
              bVar18 = true;
            }
            else {
              local_9c = uVar12;
              if (uVar12 == *(uint *)((long)t + 0x28)) {
                if (bVar9) {
                  if (uVar5 != (uint)in_R11) {
LAB_002d2d34:
                    bVar18 = false;
                    iVar17 = uVar7 - 1;
                    goto LAB_002d2df8;
                  }
                }
                else {
                  bVar9 = true;
                  if (pValue != (uint32_t *)0x0) {
                    *pValue = uVar5;
                  }
                  in_R11 = (ulong)uVar5;
                }
                uVar7 = uVar7 + unaff_R12D & -unaff_R12D;
                bVar18 = true;
              }
              else {
                iVar17 = (uVar7 & unaff_R12D - 1U) + uVar12;
                lVar16 = *(long *)((long)t + 8);
                if (cVar1 == '\x02') {
                  uVar13 = (uint32_t)*(byte *)(lVar16 + iVar17);
                }
                else if (cVar1 == '\x01') {
                  uVar13 = *(uint32_t *)(lVar16 + (long)iVar17 * 4);
                }
                else {
                  uVar13 = 0xffffffff;
                  if (cVar1 == '\0') {
                    uVar13 = (uint32_t)*(ushort *)(lVar16 + (long)iVar17 * 2);
                  }
                }
                uVar6 = uVar13;
                if (uVar13 == *(uint32_t *)((long)t + 0x2c)) {
                  uVar6 = uVar5;
                }
                if ((filter != (UCPMapValueFilter *)0x0) &&
                   (uVar13 != *(uint32_t *)((long)t + 0x2c))) {
                  in_R11 = in_R11 & 0xffffffff;
                  uVar6 = (*filter)(context,uVar13);
                }
                if (bVar9) {
                  if (uVar6 != (uint)in_R11) goto LAB_002d2d34;
                }
                else {
                  bVar9 = true;
                  if (pValue != (uint32_t *)0x0) {
                    *pValue = uVar6;
                  }
                  in_R11 = (ulong)uVar6;
                }
                lVar16 = (long)iVar17;
                iVar8 = uVar7 - 1;
                do {
                  lVar16 = lVar16 + 1;
                  uVar7 = iVar8 + 2;
                  bVar18 = (unaff_R12D - 1U & uVar7) == 0;
                  iVar17 = local_ac;
                  if (bVar18) break;
                  lVar4 = *(long *)((long)t + 8);
                  if (cVar1 == '\x02') {
                    uVar13 = (uint32_t)*(byte *)(lVar4 + lVar16);
                  }
                  else if (cVar1 == '\x01') {
                    uVar13 = *(uint32_t *)(lVar4 + lVar16 * 4);
                  }
                  else {
                    uVar13 = 0xffffffff;
                    if (cVar1 == '\0') {
                      uVar13 = (uint32_t)*(ushort *)(lVar4 + lVar16 * 2);
                    }
                  }
                  uVar6 = uVar13;
                  if (uVar13 == *(uint32_t *)((long)t + 0x2c)) {
                    uVar6 = uVar5;
                  }
                  if ((filter != (UCPMapValueFilter *)0x0) &&
                     (uVar13 != *(uint32_t *)((long)t + 0x2c))) {
                    in_R11 = in_R11 & 0xffffffff;
                    uVar6 = (*filter)(context,uVar13);
                  }
                  iVar8 = iVar8 + 1;
                  iVar17 = iVar8;
                } while (uVar6 == (uint32_t)in_R11);
              }
            }
LAB_002d2df8:
            local_ac = iVar17;
            if (!bVar18) {
              iVar17 = 1;
              goto LAB_002d2e36;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < (int)local_88);
          iVar17 = 0;
          local_a4 = uVar11;
        }
        else {
          iVar17 = ((int)uVar7 >> 0xe) + 0x3fc;
          if (*(char *)((long)t + 0x1e) != '\0') {
            iVar17 = ((int)uVar7 >> 0xe) + 0x40;
          }
          uVar2 = *(ushort *)
                   (*t + (ulong)((uVar7 >> 9 & 0x1f) + (uint)*(ushort *)(*t + (long)iVar17 * 2)) * 2
                   );
          uVar14 = (ulong)uVar2;
          uVar11 = (uint)uVar2;
          if ((local_a8 == uVar11) && (0x1ff < (int)(uVar7 - start))) {
            uVar7 = uVar7 + 0x200;
            iVar17 = 3;
            bVar18 = false;
          }
          else {
            local_a8 = uVar11;
            if (uVar2 == *(ushort *)((long)t + 0x26)) {
              if (bVar9) {
                if (uVar5 == (uint)in_R11) goto LAB_002d2b6f;
                local_ac = uVar7 - 1;
                iVar17 = 1;
              }
              else {
                bVar9 = true;
                if (pValue != (uint32_t *)0x0) {
                  *pValue = uVar5;
                }
                in_R11 = (ulong)uVar5;
LAB_002d2b6f:
                local_9c = *(uint *)((long)t + 0x28);
                uVar7 = (uVar7 & 0xfffffe00) + 0x200;
                iVar17 = 3;
              }
              bVar18 = false;
            }
            else {
              local_a4 = uVar7 >> 4 & 0x1f;
              iVar17 = 0;
              bVar18 = true;
              unaff_R12D = 0x10;
              local_88 = 0x20;
            }
          }
          if (bVar18) goto LAB_002d2b92;
        }
LAB_002d2e36:
        if ((iVar17 != 3) && (iVar17 != 0)) {
          return local_ac;
        }
      } while ((int)uVar7 < *(int *)((long)t + 0x18));
      lVar3 = (long)*(int *)((long)t + 0x14) + -2;
      lVar15 = *(long *)((long)t + 8);
      if (cVar1 == '\x02') {
        uVar13 = (uint32_t)*(byte *)(lVar15 + lVar3);
      }
      else if (cVar1 == '\x01') {
        uVar13 = *(uint32_t *)(lVar15 + (long)(int)lVar3 * 4);
      }
      else {
        uVar13 = 0xffffffff;
        if (cVar1 == '\0') {
          uVar13 = (uint32_t)*(ushort *)(lVar15 + -4 + (long)*(int *)((long)t + 0x14) * 2);
        }
      }
      if (uVar13 != *(uint32_t *)((long)t + 0x2c)) {
        uVar5 = uVar13;
      }
      if ((filter != (UCPMapValueFilter *)0x0) && (uVar13 != *(uint32_t *)((long)t + 0x2c))) {
        uVar5 = (*filter)(context,uVar13);
      }
      UVar10 = 0x10ffff;
      if (uVar5 != (uint32_t)in_R11) {
        UVar10 = uVar7 - 1;
      }
    }
    else {
      UVar10 = 0x10ffff;
      if (pValue != (uint32_t *)0x0) {
        lVar3 = (long)*(int *)((long)t + 0x14) + -2;
        lVar15 = *(long *)((long)t + 8);
        if (cVar1 == '\x02') {
          uVar5 = (uint32_t)*(byte *)(lVar15 + lVar3);
        }
        else if (cVar1 == '\x01') {
          uVar5 = *(uint32_t *)(lVar15 + (long)(int)lVar3 * 4);
        }
        else {
          uVar5 = 0xffffffff;
          if (cVar1 == '\0') {
            uVar5 = (uint32_t)*(ushort *)(lVar15 + -4 + (long)*(int *)((long)t + 0x14) * 2);
          }
        }
        if (filter != (UCPMapValueFilter *)0x0) {
          uVar5 = (*filter)(context,uVar5);
        }
        *pValue = uVar5;
      }
    }
  }
  return UVar10;
}

Assistant:

UChar32 getRange(const void *trie, UChar32 start,
                 UCPMapValueFilter *filter, const void *context, uint32_t *pValue) {
    return reinterpret_cast<const MutableCodePointTrie *>(trie)->
        getRange(start, filter, context, pValue);
}